

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

int get_curr_stat(CHAR_DATA *ch,int stat)

{
  short sVar1;
  CHAR_DATA *ch_00;
  bool bVar2;
  short sVar3;
  int iVar4;
  CClass *pCVar5;
  AFFECT_DATA *pAVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  bVar2 = is_npc(ch);
  iVar9 = 0x19;
  lVar10 = (long)stat;
  if ((bVar2) || (0x34 < ch->level)) goto LAB_002f86f3;
  sVar1 = *(short *)((long)ch->race * 0x88 + 0x4f0f90 + lVar10 * 2);
  bVar2 = str_cmp(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                  super__Vector_impl_data._M_start[ch->race].name,"human");
  if (bVar2) {
switchD_002f85b7_default:
    sVar3 = 0x19;
    if (sVar1 < 0x19) {
      sVar3 = sVar1;
    }
    iVar9 = (int)sVar3;
  }
  else {
    pCVar5 = char_data::Class(ch);
    CClass::GetIndex(pCVar5);
    pCVar5 = char_data::Class(ch);
    switch(pCVar5->attr_prime) {
    case 0:
      if (stat == 0) {
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        iVar9 = 0x17;
        if (iVar4 == 1) goto LAB_002f86f3;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 5) goto LAB_002f86f3;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 6) goto LAB_002f86f3;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 4) goto LAB_002f86f3;
      }
      break;
    case 1:
      if (stat == 1) {
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        iVar9 = 0x17;
        if (iVar4 == 0xb) goto LAB_002f86f3;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 10) goto LAB_002f86f3;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 8) goto LAB_002f86f3;
      }
      break;
    case 2:
      if (stat == 2) {
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        iVar9 = 0x17;
        if (iVar4 == 9) goto LAB_002f86f3;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 3) goto LAB_002f86f3;
      }
      break;
    case 3:
      if (stat == 3) {
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        iVar9 = 0x17;
        if (iVar4 == 7) goto LAB_002f86f3;
        pCVar5 = char_data::Class(ch);
        iVar4 = CClass::GetIndex(pCVar5);
        if (iVar4 == 2) goto LAB_002f86f3;
      }
      break;
    default:
      goto switchD_002f85b7_default;
    }
    iVar9 = 0x14;
  }
LAB_002f86f3:
  ch_00 = ch->fighting;
  iVar4 = 0;
  if (ch_00 != (CHAR_DATA *)0x0) {
    iVar8 = (int)gsn_traitors_luck;
    bVar2 = is_affected(ch_00,iVar8);
    iVar4 = 0;
    if (bVar2) {
      pAVar6 = affect_find(ch_00->affected,iVar8);
      iVar4 = (uint)(pAVar6->owner == ch) * 2;
    }
  }
  iVar8 = (int)ch->mod_stat[lVar10] + (int)ch->perm_stat[lVar10];
  if (iVar8 < iVar9) {
    iVar9 = iVar8;
  }
  iVar7 = 3;
  if (2 < iVar8) {
    iVar7 = iVar9;
  }
  iVar9 = 0x19;
  if (iVar7 + iVar4 < 0x19) {
    iVar9 = iVar7 + iVar4;
  }
  return iVar9;
}

Assistant:

int get_curr_stat(CHAR_DATA *ch, int stat)
{
	AFFECT_DATA *af;
	int max;
	int mod = 0;

	if (is_npc(ch) || ch->level > LEVEL_IMMORTAL)
		max = 25;

	else
	{
		max = pc_race_table[ch->race].max_stats[stat];

		if (!str_cmp(race_table[ch->race].name, "human"))
		{
			int iClass;
			iClass = ch->Class()->GetIndex();
			switch (ch->Class()->attr_prime)
			{
				case STAT_STR:
					if (stat == STAT_STR &&
						(ch->Class()->GetIndex() == CLASS_WARRIOR || ch->Class()->GetIndex() == CLASS_ANTI_PALADIN ||
						ch->Class()->GetIndex() == CLASS_RANGER || ch->Class()->GetIndex() == CLASS_PALADIN))
						max = 23;
					else
						max = 20;
					break;
				case STAT_INT:
					if (stat == STAT_INT &&
						(ch->Class()->GetIndex() == CLASS_SORCERER || ch->Class()->GetIndex() == CLASS_NECROMANCER ||
						ch->Class()->GetIndex() == CLASS_SHAPESHIFTER))
						max = 23;
					else
						max = 20;
					break;
				case STAT_WIS:
					if (stat == STAT_WIS &&
						(ch->Class()->GetIndex() == CLASS_HEALER || ch->Class()->GetIndex() == CLASS_ZEALOT))
						max = 23;
					else
						max = 20;
					break;
				case STAT_DEX:
					if (stat == STAT_DEX &&
						(ch->Class()->GetIndex() == CLASS_ASSASSIN || ch->Class()->GetIndex() == CLASS_THIEF))
						max = 23;
					else
						max = 20;
					break;
			}
		}

		max = std::min(max, 25);
	}

	if (ch->fighting && is_affected(ch->fighting, gsn_traitors_luck))
	{
		af = affect_find(ch->fighting->affected, gsn_traitors_luck);

		if (ch == af->owner)
			mod = 2;
	}

	return std::min(URANGE(3, ch->perm_stat[stat] + ch->mod_stat[stat], max) + mod, 25);
}